

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t fast_union_uint16(uint16_t *set_1,size_t size_1,uint16_t *set_2,size_t size_2,
                        uint16_t *buffer)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint16_t *buffer_local;
  size_t size_2_local;
  uint16_t *set_2_local;
  size_t size_1_local;
  uint16_t *set_1_local;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    if (size_1 < size_2) {
      uVar2 = union_vector16(set_1,(uint32_t)size_1,set_2,(uint32_t)size_2,buffer);
      set_1_local = (uint16_t *)(ulong)uVar2;
    }
    else {
      uVar2 = union_vector16(set_2,(uint32_t)size_2,set_1,(uint32_t)size_1,buffer);
      set_1_local = (uint16_t *)(ulong)uVar2;
    }
  }
  else if (size_1 < size_2) {
    set_1_local = (uint16_t *)union_uint16(set_1,size_1,set_2,size_2,buffer);
  }
  else {
    set_1_local = (uint16_t *)union_uint16(set_2,size_2,set_1,size_1,buffer);
  }
  return (size_t)set_1_local;
}

Assistant:

size_t fast_union_uint16(const uint16_t *set_1, size_t size_1, const uint16_t *set_2,
                    size_t size_2, uint16_t *buffer) {
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
        // compute union with smallest array first
      if (size_1 < size_2) {
        return union_vector16(set_1, (uint32_t)size_1,
                                          set_2, (uint32_t)size_2, buffer);
      } else {
        return union_vector16(set_2, (uint32_t)size_2,
                                          set_1, (uint32_t)size_1, buffer);
      }
    } else {
       // compute union with smallest array first
      if (size_1 < size_2) {
        return union_uint16(
            set_1, size_1, set_2, size_2, buffer);
      } else {
        return union_uint16(
            set_2, size_2, set_1, size_1, buffer);
      }
    }
#else
    // compute union with smallest array first
    if (size_1 < size_2) {
        return union_uint16(
            set_1, size_1, set_2, size_2, buffer);
    } else {
        return union_uint16(
            set_2, size_2, set_1, size_1, buffer);
    }
#endif
}